

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::Evaluate
          (FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Input)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  mapped_type *__x;
  mapped_type *__f;
  iterator iVar5;
  iterator iVar6;
  const_iterator cVar7;
  iterator iVar8;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  allocator<char> *in_RDI;
  vector<double,_std::allocator<double>_> prep;
  int l;
  Matrix<double> y;
  int nl;
  vector<double,_std::allocator<double>_> *NN;
  Matrix<double> *in_stack_fffffffffffffdd8;
  function<double_(const_double_&)> *in_stack_fffffffffffffde8;
  mapped_type *in_stack_fffffffffffffdf0;
  mapped_type *in_stack_fffffffffffffdf8;
  Matrix<double> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  Matrix<double> *in_stack_fffffffffffffe40;
  Matrix<double> *in_stack_fffffffffffffe48;
  Matrix<double> *in_stack_fffffffffffffe50;
  Matrix<double> *in_stack_fffffffffffffe60;
  Matrix<double> *in_stack_fffffffffffffe68;
  Matrix<double> *in_stack_fffffffffffffe70;
  Matrix<double> *in_stack_fffffffffffffe78;
  int local_7c;
  undefined1 local_39 [33];
  vector<double,_std::allocator<double>_> *local_18;
  
  local_18 = in_RDX;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  iVar2 = (int)sVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
  if (iVar2 != *pvVar4) {
    in_stack_fffffffffffffe00 = (Matrix<double> *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_fffffffffffffe20),(char *)in_RSI,in_RDI);
    Error((string *)0x102fb1);
    std::__cxx11::string::~string((string *)(local_39 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  std::vector<double,_std::allocator<double>_>::size(local_18);
  Matrix<double>::Matrix
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28);
  for (local_7c = 1; local_7c < (int)sVar3 + -1; local_7c = local_7c + 1) {
    in_stack_fffffffffffffdf8 =
         std::
         map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
         ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
               *)in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->_Lines);
    Matrix<double>::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    in_stack_fffffffffffffdf0 =
         std::
         map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
         ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
               *)in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->_Lines);
    Matrix<double>::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::function<double_(const_double_&)>::function
              ((function<double_(const_double_&)> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffde8);
    Matrix<double>::Matrix
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (function<double_(const_double_&)> *)in_stack_fffffffffffffe40);
    Matrix<double>::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    Matrix<double>::~Matrix((Matrix<double> *)0x103164);
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x103171)
    ;
    Matrix<double>::~Matrix((Matrix<double> *)0x10317e);
    Matrix<double>::~Matrix((Matrix<double> *)0x10318b);
  }
  __x = std::
        map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
              *)in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->_Lines);
  Matrix<double>::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  __f = std::
        map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
              *)in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->_Lines);
  Matrix<double>::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)in_stack_fffffffffffffdf0,
             (function<double_(const_double_&)> *)__x);
  Matrix<double>::Matrix
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (function<double_(const_double_&)> *)in_stack_fffffffffffffe40);
  Matrix<double>::GetVector(in_stack_fffffffffffffdd8);
  Matrix<double>::~Matrix((Matrix<double> *)0x103344);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x103351);
  Matrix<double>::~Matrix((Matrix<double> *)0x10335e);
  Matrix<double>::~Matrix((Matrix<double> *)0x10336b);
  bVar1 = std::operator!=((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                           *)__f,in_stack_fffffffffffffdd8);
  if (bVar1) {
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                  *)in_stack_fffffffffffffdf8,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdf0,
                 (vector<double,_std::allocator<double>_> *)__x);
    iVar5 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8);
    iVar6 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8);
    cVar7 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8);
    iVar8 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd8);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
              (iVar5._M_current,iVar6._M_current,cVar7._M_current,iVar8._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdf0);
  }
  Matrix<double>::~Matrix((Matrix<double> *)0x103514);
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<T> Evaluate(std::vector<T> const& Input) const
    {
      // Check that the size of the input vector is equal to the number of
      // input nodes.
      if ((int) Input.size() != _Arch[0])
        Error("Evaluate: the number of inputs does not match the number of input nodes.");

      // Number of layers
      const int nl = (int) _Arch.size();

      // Construct output of the NN recursively for the hidden layers
      Matrix<T> y{(int) Input.size(), 1, Input};
      for (int l = 1; l < nl - 1; l++)
        y = Matrix<T> {_Links.at(l) * y + _Biases.at(l), _ActFun};

      // Compute NN
      std::vector<T> NN = (Matrix<T> {_Links.at(nl - 1) * y + _Biases.at(nl - 1), _OutputActFun}).GetVector();

      // Include preprocessing function if necessary
      if (_Preproc != nullptr)
        {
          const std::vector<T> prep = _Preproc(Input, _PreprocPars);
          std::transform(NN.begin(), NN.end(), prep.begin(), NN.begin(), std::multiplies<T>());
        }

      return NN;
    }